

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

ON_SHA1_Hash * __thiscall ON_DimStyle::ParentContentHash(ON_DimStyle *this)

{
  undefined8 uVar1;
  bool bVar2;
  
  bVar2 = ON_ModelComponent::ParentIdIsNil(&this->super_ON_ModelComponent);
  if ((bVar2) && (this->m_field_override_parent_count == 0)) {
    *(undefined4 *)((this->m_parent_dim_style_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(this->m_parent_dim_style_content_hash).m_digest =
         ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_parent_dim_style_content_hash).m_digest + 8) = uVar1;
  }
  return &this->m_parent_dim_style_content_hash;
}

Assistant:

const ON_SHA1_Hash& ON_DimStyle::ParentContentHash() const
{
  // The value of m_parent_dim_style_content_hash cannot be reliably cleared 
  // because ParentId() is maintained on a base class. So a "lazy" check on
  // a mutable m_parent_dim_style_content_hash is used.
  if (ParentIdIsNil() && m_field_override_parent_count <= 0)
  {
    // no parent at this point.
    m_parent_dim_style_content_hash = ON_SHA1_Hash::EmptyContentHash;
  }
  return m_parent_dim_style_content_hash;
}